

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O2

void virtio_legacy_setup_tx_queue(virtio_device *dev,uint16_t idx)

{
  undefined8 *puVar1;
  size_t size;
  uint uVar2;
  undefined2 *puVar3;
  undefined2 *puVar4;
  FILE *__stream;
  uint16_t uVar5;
  void *__s;
  uint *puVar6;
  void *pvVar7;
  mempool *pmVar8;
  ulong uVar9;
  long lVar10;
  uint num_entries;
  dma_memory dVar11;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar12;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if ((ushort)(idx - 3) < 0xfffe) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): Can\'t setup queue %u as Tx queue\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x31,"virtio_legacy_setup_tx_queue",2);
    abort();
  }
  write_io16(dev->fd,idx,0xe);
  uVar5 = read_io16(dev->fd,0xc);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x37,"virtio_legacy_setup_tx_queue",idx,CONCAT44(uVar12,(uint)uVar5));
  if (uVar5 == 0) {
    return;
  }
  size = (ulong)((uint)uVar5 * 0x12 + 0x1003 & 0x3ff000) + 4 + (ulong)((uint)uVar5 * 8);
  dVar11 = memory_allocate_dma(size,true);
  __s = dVar11.virt;
  memset(__s,0xab,size);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x3e,"virtio_legacy_setup_tx_queue",size,__s);
  write_io32(dev->fd,(uint32_t)(dVar11.phy >> 0xc),8);
  puVar6 = (uint *)calloc(1,(ulong)((uint)uVar5 * 8) + 0x38);
  num_entries = (uint)uVar5;
  *puVar6 = num_entries;
  __stream = _stderr;
  *(void **)(puVar6 + 2) = __s;
  pvVar7 = (void *)((ulong)uVar5 * 0x10 + (long)__s);
  *(void **)(puVar6 + 4) = pvVar7;
  uVar9 = (long)pvVar7 + (ulong)num_entries * 2 + 0x1003 & 0xfffffffffffff000;
  *(ulong *)(puVar6 + 6) = uVar9;
  fprintf(__stream,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x44,"virtio_legacy_setup_tx_queue",__s,pvVar7,uVar9);
  uVar2 = *puVar6;
  for (lVar10 = 0; (ulong)uVar2 * 2 != lVar10; lVar10 = lVar10 + 2) {
    puVar1 = (undefined8 *)(*(long *)(puVar6 + 2) + lVar10 * 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined2 *)(*(long *)(puVar6 + 4) + 4 + lVar10) = 0;
    *(undefined8 *)(*(long *)(puVar6 + 6) + 4 + lVar10 * 4) = 0;
  }
  puVar3 = *(undefined2 **)(puVar6 + 6);
  puVar3[1] = 0;
  puVar4 = *(undefined2 **)(puVar6 + 4);
  puVar4[1] = 0;
  *(undefined2 *)(puVar6 + 10) = 0;
  uVar5 = read_io16(dev->fd,0x10);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x54,"virtio_legacy_setup_tx_queue",(ulong)uVar5,pvVar7,uVar9);
  *(ulong *)(puVar6 + 8) = (ulong)uVar5;
  if (idx == 2) {
    pmVar8 = memory_allocate_mempool(num_entries,0x800);
    *(mempool **)(puVar6 + 0xc) = pmVar8;
    *puVar4 = 1;
    *puVar3 = 0;
  }
  else {
    *puVar4 = 1;
    *puVar3 = 0;
    lVar10 = 0x80;
    if (idx == 1) goto LAB_00105b86;
  }
  lVar10 = 0x88;
LAB_00105b86:
  *(uint **)((long)&(dev->ixy).pci_addr + lVar10) = puVar6;
  return;
}

Assistant:

static void virtio_legacy_setup_tx_queue(struct virtio_device* dev, uint16_t idx) {
	if (idx != 1 && idx != 2) {
		error("Can't setup queue %u as Tx queue", idx);
	}

	// Create virt queue itself - Section 4.1.5.1.3
	write_io16(dev->fd, idx, VIRTIO_PCI_QUEUE_SEL);
	uint32_t max_queue_size = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NUM);
	debug("Max queue size of tx queue #%u: %u", idx, max_queue_size);
	if (max_queue_size == 0) {
		return;
	}
	size_t virt_queue_mem_size = virtio_legacy_vring_size(max_queue_size, 4096);
	struct dma_memory mem = memory_allocate_dma(virt_queue_mem_size, true);
	memset(mem.virt, 0xab, virt_queue_mem_size);
	debug("Allocated %zu bytes for virt queue at %p", virt_queue_mem_size, mem.virt);
	write_io32(dev->fd, mem.phy >> VIRTIO_PCI_QUEUE_ADDR_SHIFT, VIRTIO_PCI_QUEUE_PFN);

	// Section 2.4.2 for layout
	struct virtqueue* vq = calloc(1, sizeof(*vq) + sizeof(void*) * max_queue_size);
	virtio_legacy_vring_init(&vq->vring, max_queue_size, mem.virt, 4096);
	debug("vring desc: %p, vring avail: %p, vring used: %p", vq->vring.desc, vq->vring.avail, vq->vring.used);
	for (size_t i = 0; i < vq->vring.num; ++i) {
		vq->vring.desc[i].len = 0;
		vq->vring.desc[i].addr = 0;
		vq->vring.desc[i].flags = 0;
		vq->vring.desc[i].next = 0;
		vq->vring.avail->ring[i] = 0;
		vq->vring.used->ring[i].id = 0;
		vq->vring.used->ring[i].len = 0;
	}
	vq->vring.used->idx = 0;
	vq->vring.avail->idx = 0;
	vq->vq_used_last_idx = 0;

	// Section 4.1.4.4
	uint32_t notify_offset = read_io16(dev->fd, VIRTIO_PCI_QUEUE_NOTIFY);
	debug("vq notifcation offset %u", notify_offset);
	vq->notification_offset = notify_offset;

	// Ctrl queue packets are not supplied by the user
	if (idx == 2) {
		vq->mempool = memory_allocate_mempool(max_queue_size, 2048);
	}

	// Disable interrupts - Section 2.4.7
	vq->vring.avail->flags = VRING_AVAIL_F_NO_INTERRUPT;
	vq->vring.used->flags = 0;

	if (idx == 1) {
		dev->tx_queue = vq;
	} else {
		dev->ctrl_queue = vq;
	}
}